

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_audio_buffer_ref_seek_to_pcm_frame
                    (ma_audio_buffer_ref *pAudioBufferRef,ma_uint64 frameIndex)

{
  ma_result mVar1;
  
  mVar1 = MA_INVALID_ARGS;
  if ((pAudioBufferRef != (ma_audio_buffer_ref *)0x0) &&
     (frameIndex <= pAudioBufferRef->sizeInFrames)) {
    pAudioBufferRef->cursor = frameIndex;
    mVar1 = MA_SUCCESS;
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_audio_buffer_ref_seek_to_pcm_frame(ma_audio_buffer_ref* pAudioBufferRef, ma_uint64 frameIndex)
{
    if (pAudioBufferRef == NULL) {
        return MA_INVALID_ARGS;
    }

    if (frameIndex > pAudioBufferRef->sizeInFrames) {
        return MA_INVALID_ARGS;
    }

    pAudioBufferRef->cursor = (size_t)frameIndex;

    return MA_SUCCESS;
}